

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void assembler(istream *input,ostream *output)

{
  Assembler ab;
  Tokenizer tkz;
  Error err;
  vector<Token,_std::allocator<Token>_> local_460;
  Assembler local_448;
  Tokenizer local_3b0;
  Analyser local_378;
  Analyser local_1c8;
  
  local_3b0._initialized = false;
  local_3b0._lines_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b0._lines_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b0._lines_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0._ptr.first = 0;
  local_3b0._ptr.second = 0;
  local_3b0._rdr = input;
  Tokenizer::Tokenize(&local_460,&local_3b0);
  Analyser::Analyser(&local_378,&local_460);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_460);
  Analyser::Analyse(&local_378);
  Analyser::Analyser(&local_1c8,&local_378);
  Assembler::Assembler(&local_448,output,&local_1c8);
  Analyser::~Analyser(&local_1c8);
  Assembler::Assemble(&local_448);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_448._functionParameter._M_t);
  if (local_448._functionNameConstant.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448._functionNameConstant.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_448._functionNameConstant.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_448._functionNameConstant.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
  ::~vector(&local_448._instructions);
  if (local_448._startInstructions.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448._startInstructions.
                    super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_448._startInstructions.
                          super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_448._startInstructions.
                          super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<std::any,_std::allocator<std::any>_>::~vector(&local_448._consts);
  Analyser::~Analyser(&local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b0._lines_buffer);
  return;
}

Assistant:

void assembler(std::istream& input, std::ostream& output) {
	try {
		Tokenizer tkz(input);
		Analyser as(tkz.Tokenize());
		as.Analyse();
		Assembler ab(output, as);
		ab.Assemble();
	}
	catch (Error err) {
		err.printErrorMessage();
	}
}